

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O0

DOMDocument * parseFile(char *fileName)

{
  XercesDOMParser *this;
  DOMDocument *pDVar1;
  ulong in_RSI;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  ParseErrorHandler local_20;
  ParseErrorHandler eh;
  char *fileName_local;
  
  eh.super_ErrorHandler._vptr_ErrorHandler = (ErrorHandler)(ErrorHandler)fileName;
  ParseErrorHandler::ParseErrorHandler(&local_20);
  if (parser == (XercesDOMParser *)0x0) {
    this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,in_RSI);
    xercesc_4_0::XercesDOMParser::XercesDOMParser
              (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    parser = this;
  }
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)parser);
  xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)parser);
  xercesc_4_0::AbstractDOMParser::parse((char *)parser);
  pDVar1 = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  ParseErrorHandler::~ParseErrorHandler(&local_20);
  return pDVar1;
}

Assistant:

static DOMDocument* parseFile(char *fileName)
{
    ParseErrorHandler eh;
    if (!parser)
        parser = new XercesDOMParser;
    parser->setValidationScheme(AbstractDOMParser::Val_Never);
    parser->setErrorHandler(&eh);
    try
    {
        parser->parse(fileName);
    }
    catch (const OutOfMemoryException&)
    {
	    fprintf(stderr, "OutOfMemoryException during parsing: %s\n", fileName);
	    return 0;
    }
    catch (const XMLException& e )
    {
		fprintf(stderr, "Exception Occurred \"%s\".  \n",
			XMLString::transcode(e.getMessage()));
		fprintf(stderr, "File being parsed is \"%s\".\n", fileName);
        return 0;  // A null document.
    }

	catch (...)
	{
		fprintf(stderr, "Unexpected Exception thrown during parse of file \"%s\".\n",
		                 fileName);
		return 0;
	}
    return parser->getDocument();
}